

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall
ncnn::Crop::eval_crop_expr
          (Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *_woffset,
          int *_hoffset,int *_doffset,int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pMVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  int *piVar18;
  vector<int,_std::allocator<int>_> _ends;
  vector<int,_std::allocator<int>_> _starts;
  int _axes4 [4];
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  int *local_80;
  pointer local_78;
  pointer local_70;
  vector<int,_std::allocator<int>_> local_68;
  int local_48 [6];
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar7 = eval_list_expression(&this->starts_expr,bottom_blobs,&local_68);
  iVar11 = -1;
  if (iVar7 != 0) goto LAB_0026ffa6;
  iVar7 = eval_list_expression(&this->ends_expr,bottom_blobs,&local_98);
  if (iVar7 == 0) {
    iVar7 = eval_list_expression(&this->axes_expr,bottom_blobs,&local_b8);
    iVar11 = -1;
    if (iVar7 == 0) {
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = pMVar6->dims;
      uVar2 = pMVar6->w;
      uVar3 = pMVar6->h;
      uVar4 = pMVar6->d;
      uVar5 = pMVar6->c;
      *_woffset = 0;
      *_hoffset = 0;
      *_doffset = 0;
      *_coffset = 0;
      *_outw = uVar2;
      *_outh = uVar3;
      *_outd = uVar4;
      *_outc = uVar5;
      local_70 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_48[0] = 0;
      local_48[1] = 1;
      local_48[2] = 2;
      local_48[3] = 3;
      uVar8 = (uint)((ulong)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      uVar9 = uVar1;
      if (uVar8 == 0) {
LAB_0026fe1b:
        if (0 < (int)uVar9) {
          uVar10 = 0;
          do {
            if (uVar1 - 1 < 4) {
              iVar7 = local_48[uVar10];
              piVar14 = _woffset;
              piVar18 = _outw;
              uVar8 = uVar2;
              switch(uVar1) {
              case 2:
                piVar14 = _hoffset;
                piVar13 = _woffset;
                piVar18 = _outh;
                piVar17 = _outw;
                uVar8 = uVar3;
                uVar12 = uVar2;
                if (iVar7 != 0) {
LAB_0026fedb:
                  piVar14 = piVar13;
                  piVar18 = piVar17;
                  uVar8 = uVar12;
                  if (iVar7 != 1) goto switchD_0026ff11_default;
                }
                break;
              case 3:
                piVar14 = _coffset;
                piVar18 = _outc;
                uVar8 = uVar5;
                if ((iVar7 != 0) &&
                   (piVar14 = _woffset, piVar13 = _hoffset, piVar18 = _outw, piVar17 = _outh,
                   uVar8 = uVar2, uVar12 = uVar3, iVar7 != 2)) goto LAB_0026fedb;
                break;
              case 4:
                piVar14 = _coffset;
                piVar18 = _outc;
                uVar8 = uVar5;
                switch(iVar7) {
                case 0:
                  break;
                case 1:
                  piVar14 = _doffset;
                  piVar18 = _outd;
                  uVar8 = uVar4;
                  break;
                case 2:
                  piVar14 = _hoffset;
                  piVar18 = _outh;
                  uVar8 = uVar3;
                  break;
                case 3:
                  piVar14 = _woffset;
                  piVar18 = _outw;
                  uVar8 = uVar2;
                  break;
                default:
                  goto switchD_0026ff11_default;
                }
              }
              iVar7 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] == -0xe9) {
                iVar7 = 0;
              }
              uVar12 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
              if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] == 0xffffff17) {
                uVar12 = uVar8;
              }
              iVar7 = (iVar7 >> 0x1f & uVar8) + iVar7;
              *piVar14 = iVar7;
              uVar15 = 0;
              if ((int)uVar12 < 1) {
                uVar15 = uVar8;
              }
              uVar16 = uVar15 + uVar12;
              if ((int)uVar8 <= (int)(uVar15 + uVar12)) {
                uVar16 = uVar8;
              }
              *piVar18 = uVar16 - iVar7;
            }
switchD_0026ff11_default:
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      else if (0 < (int)uVar8) {
        uVar10 = 0;
        do {
          local_48[uVar10] =
               (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] >> 0x1f & uVar1) +
               local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
          uVar10 = uVar10 + 1;
          uVar9 = uVar8;
        } while ((uVar8 & 0x7fffffff) != uVar10);
        goto LAB_0026fe1b;
      }
      iVar11 = 0;
      local_80 = _doffset;
    }
  }
  else {
    iVar11 = -1;
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0026ffa6:
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar11;
}

Assistant:

int Crop::eval_crop_expr(const std::vector<Mat>& bottom_blobs, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    std::vector<int> _starts;
    std::vector<int> _ends;
    std::vector<int> _axes;
    int er = eval_list_expression(starts_expr, bottom_blobs, _starts);
    if (er != 0)
        return -1;

    er = eval_list_expression(ends_expr, bottom_blobs, _ends);
    if (er != 0)
        return -1;

    er = eval_list_expression(axes_expr, bottom_blobs, _axes);
    if (er != 0)
        return -1;

    // NCNN_LOGE("%d %d %d", _starts[0], _ends[0], _axes[0]);

    const Mat& bottom_blob = bottom_blobs[0];
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int dims = bottom_blob.dims;

    _woffset = 0;
    _hoffset = 0;
    _doffset = 0;
    _coffset = 0;
    _outw = w;
    _outh = h;
    _outd = d;
    _outc = channels;

    const int* starts_ptr = _starts.data();
    const int* ends_ptr = _ends.data();
    const int* axes_ptr = _axes.data();

    int _axes4[4] = {0, 1, 2, 3};
    int num_axis = (int)_axes.size();
    if (num_axis == 0)
    {
        num_axis = dims;
    }
    else
    {
        for (int i = 0; i < num_axis; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;
            _axes4[i] = axis;
        }
    }

    for (int i = 0; i < num_axis; i++)
    {
        int axis = _axes4[i];
        int start = starts_ptr[i];
        int end = ends_ptr[i];

        if (dims == 1) // axis == 0
        {
            if (start == -233) start = 0;
            if (end == -233) end = w;
            _woffset = start >= 0 ? start : w + start;
            _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
        }
        if (dims == 2)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 3)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 4)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = d;
                _doffset = start >= 0 ? start : d + start;
                _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 3)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
    }

    return 0;
}